

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int JX9StreamData_Open(char *zName,int iMode,jx9_value *pResource,void **ppHandle)

{
  char cVar1;
  int iType;
  sxu32 sVar2;
  sxi32 sVar3;
  ushort **ppuVar4;
  jx9_stream_data *pjVar5;
  int iVar6;
  jx9_vm *pVm;
  char *pcVar7;
  char *zLeft;
  bool bVar8;
  
  sVar2 = SyStrlen(zName);
  pcVar7 = zName + sVar2;
  while (((bVar8 = sVar2 != 0, sVar2 = sVar2 - 1, zLeft = pcVar7, bVar8 &&
          (cVar1 = *zName, zLeft = zName, (ulong)(long)cVar1 < 0xffffffffffffffc0)) &&
         (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0))
        ) {
    zName = zName + 1;
  }
  sVar3 = SyStrnicmp(zLeft,"stdin",5);
  iVar6 = -1;
  if (sVar3 == 0) {
    iType = 1;
  }
  else {
    sVar3 = SyStrnicmp(zLeft,"output",6);
    if (sVar3 == 0) {
      iType = 4;
    }
    else {
      sVar3 = SyStrnicmp(zLeft,"stdout",6);
      if (sVar3 == 0) {
        iType = 2;
      }
      else {
        sVar3 = SyStrnicmp(zLeft,"stderr",6);
        if (sVar3 != 0) {
          return -1;
        }
        iType = 3;
      }
    }
  }
  if (pResource == (jx9_value *)0x0) {
    pVm = (jx9_vm *)0x0;
  }
  else {
    pVm = pResource->pVm;
  }
  pjVar5 = JX9StreamDataInit(pVm,iType);
  if (pjVar5 != (jx9_stream_data *)0x0) {
    *ppHandle = pjVar5;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int JX9StreamData_Open(const char *zName, int iMode, jx9_value *pResource, void ** ppHandle)
{
	jx9_stream_data *pData;
	SyString sStream;
	SyStringInitFromBuf(&sStream, zName, SyStrlen(zName));
	/* Trim leading and trailing white spaces */
	SyStringFullTrim(&sStream);
	/* Stream to open */
	if( SyStrnicmp(sStream.zString, "stdin", sizeof("stdin")-1) == 0 ){
		iMode = JX9_IO_STREAM_STDIN;
	}else if( SyStrnicmp(sStream.zString, "output", sizeof("output")-1) == 0 ){
		iMode = JX9_IO_STREAM_OUTPUT;
	}else if( SyStrnicmp(sStream.zString, "stdout", sizeof("stdout")-1) == 0 ){
		iMode = JX9_IO_STREAM_STDOUT;
	}else if( SyStrnicmp(sStream.zString, "stderr", sizeof("stderr")-1) == 0 ){
		iMode = JX9_IO_STREAM_STDERR;
	}else{
		/* unknown stream name */
		return -1;
	}
	/* Create our handle */
	pData = JX9StreamDataInit(pResource?pResource->pVm:0, iMode);
	if( pData == 0 ){
		return -1;
	}
	/* Make the handle public */
	*ppHandle = (void *)pData;
	return JX9_OK;
}